

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  function<bool_(std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>_&)> *pfVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  pointer pFVar6;
  ostream *poVar7;
  undefined8 extraout_RAX;
  int i;
  uint uVar8;
  Facet *f;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Extent domain;
  vector<double,_std::allocator<double>_> dist;
  PriorityQueue process;
  string filename;
  STL stl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  set<int,_std::less<int>,_std::allocator<int>_> tags;
  DistanceTree tree;
  ImportedUgrid ugrid;
  CurrentState local_438;
  ulong local_3f0;
  ulong local_3e8;
  vector<double,_std::allocator<double>_> local_3e0;
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
  local_3c8;
  string local_3a0;
  undefined8 local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  Point<double> local_348;
  string local_330;
  string local_310;
  STL local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  string local_2a0;
  long *local_280 [2];
  long local_270 [2];
  CurrentState local_260;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_220;
  DistanceTree local_1f0;
  ImportedUgrid local_160;
  
  launderArguments_abi_cxx11_(&local_2b8,argc,argv);
  bVar4 = isVersionRequested(&local_2b8);
  if (bVar4) {
    printVersionAndExit();
    __clang_call_terminate(extraout_RAX);
  }
  getFilename(&local_3a0,&local_2b8);
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_280,local_3a0._M_dataplus._M_p,
             local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
  lVar5 = std::__cxx11::string::find((char *)local_280,0x10e1dc,0);
  if (local_280[0] != local_270) {
    operator_delete(local_280[0],local_270[0] + 1);
  }
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_3a0._M_dataplus._M_p,
             local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
  Parfait::ImportedUgridFactory::readUgrid(&local_160,&local_310,lVar5 != -1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  getWallTags((set<int,_std::less<int>,_std::allocator<int>_> *)&local_220,&local_160);
  cacheSurface(&local_2f0,&local_160,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_220);
  local_438.query_point.pos._M_elems[0] = 2e+21;
  local_438.query_point.pos._M_elems[1] = 2e+21;
  local_438.query_point.pos._M_elems[2] = 2e+21;
  local_438.surface_location.pos._M_elems[0] = -2e+21;
  local_438.surface_location.pos._M_elems[1] = -2e+21;
  local_438.surface_location.pos._M_elems[2]._0_1_ = 0x50;
  local_438.surface_location.pos._M_elems[2]._1_7_ = 0xc45b1ae4d6e2ef;
  for (pFVar6 = local_2f0.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar6 != local_2f0.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>
                ._M_impl.super__Vector_impl_data._M_finish; pFVar6 = pFVar6 + 1) {
    lVar5 = 0;
    do {
      dVar13 = (pFVar6->points)._M_elems[0].pos._M_elems[lVar5];
      dVar12 = local_438.query_point.pos._M_elems[lVar5];
      dVar14 = local_438.surface_location.pos._M_elems[lVar5];
      if (dVar13 <= dVar12) {
        dVar12 = dVar13;
      }
      local_438.query_point.pos._M_elems[lVar5] = dVar12;
      dVar2 = (&pFVar6->normal)[-2].pos._M_elems[lVar5];
      if (dVar2 <= dVar12) {
        dVar12 = dVar2;
      }
      local_438.query_point.pos._M_elems[lVar5] = dVar12;
      dVar3 = (&pFVar6->normal)[-1].pos._M_elems[lVar5];
      if (dVar3 <= dVar12) {
        dVar12 = dVar3;
      }
      local_438.query_point.pos._M_elems[lVar5] = dVar12;
      if (dVar14 <= dVar13) {
        dVar14 = dVar13;
      }
      if (dVar14 <= dVar2) {
        dVar14 = dVar2;
      }
      if (dVar14 <= dVar3) {
        dVar14 = dVar3;
      }
      local_438.surface_location.pos._M_elems[lVar5] = dVar14;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  Parfait::DistanceTree::DistanceTree(&local_1f0,(Extent<double> *)&local_438);
  local_1f0.super_Octree<Parfait::Facet>.max_depth = 0x1a;
  if (local_2f0.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2f0.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar6 = local_2f0.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      Parfait::Octree<Parfait::Facet>::insert(&local_1f0.super_Octree<Parfait::Facet>,pFVar6);
      pFVar6 = pFVar6 + 1;
    } while (pFVar6 != local_2f0.facets.
                       super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  Parfait::Octree<Parfait::Facet>::finalize(&local_1f0.super_Octree<Parfait::Facet>);
  local_380 = std::chrono::_V2::system_clock::now();
  uVar9 = (ulong)((long)local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) / 3;
  uVar8 = (uint)uVar9;
  local_438.query_point.pos._M_elems[0] = -1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_3e0,(long)(int)uVar8,(value_type_conflict *)&local_438,
             (allocator_type *)&local_260);
  printf("Searching for distance of %d points\n",uVar9 & 0xffffffff);
  local_3f0 = uVar9;
  if (0 < (int)uVar8) {
    local_3f0 = (ulong)(uVar8 & 0x7fffffff);
    uVar9 = 0;
    do {
      local_358 = local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9 * 3];
      local_360 = local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9 * 3 + 1];
      local_350 = local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9 * 3 + 2];
      local_348.pos._M_elems[0] =
           local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar9 * 3];
      local_348.pos._M_elems[1] =
           local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar9 * 3 + 1];
      local_348.pos._M_elems[2] =
           local_160.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar9 * 3 + 2];
      local_3c8.c.
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3c8.c.
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3c8.c.
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_438.query_point.pos._M_elems[0] = 1.79769313486232e+308;
      local_438.query_point.pos._M_elems[1] =
           (double)((ulong)local_438.query_point.pos._M_elems[1] & 0xffffffff00000000);
      local_3e8 = uVar9;
      std::
      priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
      ::push(&local_3c8,(value_type *)&local_438);
      local_438.query_point.pos._M_elems[2] = local_348.pos._M_elems[2];
      local_438.query_point.pos._M_elems[0] = local_348.pos._M_elems[0];
      local_438.query_point.pos._M_elems[1] = local_348.pos._M_elems[1];
      local_438.surface_location.pos._M_elems[0] = 0.0;
      local_438.surface_location.pos._M_elems[1] = 0.0;
      local_438.surface_location.pos._M_elems[2]._0_1_ = 0;
      local_438.surface_location.pos._M_elems[2]._1_7_ = 0;
      local_438.actual_distance._0_1_ = 0xff;
      local_438.actual_distance._1_7_ = 0x7fefffffffffff;
      local_438.found_on_surface = false;
      do {
        if (local_3c8.c.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_3c8.c.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        Parfait::DistanceTree::closestPoint(&local_260,&local_1f0,&local_348,&local_438,&local_3c8);
        local_438.query_point.pos._M_elems[0] = local_260.query_point.pos._M_elems[0];
        local_438.query_point.pos._M_elems[1] = local_260.query_point.pos._M_elems[1];
        local_438.query_point.pos._M_elems[2] = local_260.query_point.pos._M_elems[2];
        local_438.surface_location.pos._M_elems[0] = local_260.surface_location.pos._M_elems[0];
        local_438.surface_location.pos._M_elems[1] = local_260.surface_location.pos._M_elems[1];
        local_438.actual_distance._0_1_ = local_260.actual_distance._0_1_;
        local_438.actual_distance._1_7_ = local_260.actual_distance._1_7_;
        local_438.found_on_surface = local_260.found_on_surface;
        local_438.surface_location.pos._M_elems[2]._0_1_ =
             local_260.surface_location.pos._M_elems[2]._0_1_;
        local_438.surface_location.pos._M_elems[2]._1_7_ =
             local_260.surface_location.pos._M_elems[2]._1_7_;
      } while ((local_3c8.c.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first <
               (double)CONCAT71(local_438.actual_distance._1_7_,local_260.actual_distance._0_1_) ||
               (local_3c8.c.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first ==
               (double)CONCAT71(local_438.actual_distance._1_7_,local_260.actual_distance._0_1_));
      uVar10 = SUB84(local_438.surface_location.pos._M_elems[1],0);
      uVar11 = (undefined4)((ulong)local_438.surface_location.pos._M_elems[1] >> 0x20);
      dVar13 = local_438.surface_location.pos._M_elems[0];
      dVar12 = (double)CONCAT71(local_438.surface_location.pos._M_elems[2]._1_7_,
                                local_438.surface_location.pos._M_elems[2]._0_1_);
      if (local_3c8.c.
          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        local_370 = local_438.surface_location.pos._M_elems[1];
        local_378 = local_438.surface_location.pos._M_elems[0];
        local_368 = (double)CONCAT71(local_438.surface_location.pos._M_elems[2]._1_7_,
                                     local_438.surface_location.pos._M_elems[2]._0_1_);
        operator_delete(local_3c8.c.
                        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_3c8.c.
                              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_3c8.c.
                              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        uVar10 = SUB84(local_370,0);
        uVar11 = (undefined4)((ulong)local_370 >> 0x20);
        dVar13 = local_378;
        dVar12 = local_368;
      }
      dVar14 = local_360 - (double)CONCAT44(uVar11,uVar10);
      dVar13 = (local_350 - dVar12) * (local_350 - dVar12) +
               (local_358 - dVar13) * (local_358 - dVar13) + dVar14 * dVar14;
      if (dVar13 < 0.0) {
        dVar13 = sqrt(dVar13);
      }
      else {
        dVar13 = SQRT(dVar13);
      }
      local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[local_3e8] = dVar13;
      uVar9 = local_3e8 + 1;
    } while (uVar9 != local_3f0);
  }
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Elapsed time ",0xd);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"distance.txt","");
  writeToFile(&local_2a0,&local_3e0,&local_160.nodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"boundary.txt","");
  determineIfBoundaryNodes((vector<int,_std::allocator<int>_> *)&local_438,&local_160);
  writeBoundaryDistances(&local_330,&local_3e0,(vector<int,_std::allocator<int>_> *)&local_438);
  if ((void *)local_438.query_point.pos._M_elems[0] != (void *)0x0) {
    operator_delete((void *)local_438.query_point.pos._M_elems[0],
                    (long)local_438.query_point.pos._M_elems[2] -
                    (long)local_438.query_point.pos._M_elems[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.super_Octree<Parfait::Facet>.objects.
      super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.super_Octree<Parfait::Facet>.objects.
                    super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super_Octree<Parfait::Facet>.objects.
                          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super_Octree<Parfait::Facet>.objects.
                          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
  ::~vector(&local_1f0.super_Octree<Parfait::Facet>.voxels);
  if (local_1f0.super_Octree<Parfait::Facet>.should_split.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    pfVar1 = &local_1f0.super_Octree<Parfait::Facet>.should_split;
    (*local_1f0.super_Octree<Parfait::Facet>.should_split.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if (local_2f0.facets.super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
      super__Vector_impl_data._M_start != (Facet *)0x0) {
    operator_delete(local_2f0.facets.
                    super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f0.facets.
                          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.facets.
                          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.filename._M_dataplus._M_p != &local_2f0.filename.field_2) {
    operator_delete(local_2f0.filename._M_dataplus._M_p,
                    local_2f0.filename.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_220);
  Parfait::ImportedUgrid::~ImportedUgrid(&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    std::vector<std::string> arguments = launderArguments(argc, argv);
    if(isVersionRequested(arguments))
        printVersionAndExit();

    std::string filename = getFilename(arguments);
    bool is_big_endian = isBigEndian(filename);

    auto ugrid = Parfait::ImportedUgridFactory::readUgrid(filename, is_big_endian);
    auto tags = getWallTags(ugrid);


    auto stl = cacheSurface(ugrid, tags);

    Parfait::DistanceTree tree(stl.findDomain());
    tree.setMaxDepth(26);

    for(const auto& f : stl.facets){
        tree.insert(f);
    }
    tree.finalize();

    auto start = std::chrono::system_clock::now();
    int nnodes = ugrid.nodes.size() / 3;
    std::vector<double> dist(nnodes, -1);
    printf("Searching for distance of %d points\n", nnodes);
#pragma omp parallel for schedule(guided)
    for(int n = 0; n < nnodes; n++){
        auto p = &ugrid.nodes[3*n+0];
        Parfait::Point<double> point(p[0], p[1], p[2]);
        auto c = tree.closestPoint(p);
        dist[n] = (point - c).magnitude();
    }
    auto end = std::chrono::system_clock::now();
    std::cout << "Elapsed time " << std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count() << std::endl;

    writeToFile("distance.txt", dist, ugrid.nodes);
    writeBoundaryDistances("boundary.txt", dist, determineIfBoundaryNodes(ugrid));
    //printf("Exporting <%s> as vtu.", filename.c_str());
    //Parfait::VtkUnstructuredWriter writer(filename, ugrid);
    //writer.addNodeData("distance", dist.data(), 1);
    //writer.writeBinary();
}